

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_digest.cc
# Opt level: O0

int ASN1_digest(undefined1 *i2d,EVP_MD *type,char *data,uchar *md,uint *len)

{
  uchar *local_50;
  uchar *p;
  uchar *str;
  int ret;
  int i;
  uint *len_local;
  uchar *md_local;
  char *data_local;
  EVP_MD *type_local;
  i2d_of_void *i2d_local;
  
  _ret = len;
  len_local = (uint *)md;
  md_local = (uchar *)data;
  data_local = (char *)type;
  type_local = (EVP_MD *)i2d;
  str._4_4_ = (*(code *)i2d)(data,0);
  local_50 = (uchar *)OPENSSL_malloc((long)str._4_4_);
  if (local_50 == (uchar *)0x0) {
    i2d_local._4_4_ = 0;
  }
  else {
    p = local_50;
    (*(code *)type_local)(md_local,&local_50);
    str._0_4_ = EVP_Digest(p,(long)str._4_4_,(uchar *)len_local,_ret,(EVP_MD *)data_local,
                           (ENGINE *)0x0);
    OPENSSL_free(p);
    i2d_local._4_4_ = (int)str;
  }
  return i2d_local._4_4_;
}

Assistant:

int ASN1_digest(i2d_of_void *i2d, const EVP_MD *type, char *data,
                unsigned char *md, unsigned int *len) {
  int i, ret;
  unsigned char *str, *p;

  i = i2d(data, NULL);
  if ((str = (unsigned char *)OPENSSL_malloc(i)) == NULL) {
    return 0;
  }
  p = str;
  i2d(data, &p);

  ret = EVP_Digest(str, i, md, len, type, NULL);
  OPENSSL_free(str);
  return ret;
}